

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPPacketBuilder::PrivateBuildPacket
          (RTPPacketBuilder *this,void *data,size_t len,uint8_t pt,bool mark,uint32_t timestampinc,
          bool gotextension,uint16_t hdrextID,void *hdrextdata,size_t numhdrextwords)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  int iVar4;
  RTPTime RVar5;
  RTPPacket p;
  
  RTPPacket::RTPPacket
            (&p,pt,data,len,this->seqnr,this->timestamp,this->ssrc,mark,(uint8_t)this->numcsrcs,
             this->csrcs,gotextension,hdrextID,(uint16_t)numhdrextwords,hdrextdata,this->buffer,
             this->maxpacksize,(this->super_RTPMemoryObject).mgr);
  iVar4 = p.error;
  if (p.error < 0) goto LAB_001329eb;
  this->packetlength = p.packetlength;
  if (this->numpackets == 0) {
    RVar5 = RTPTime::CurrentTime();
LAB_001329a0:
    (this->lastwallclocktime).m_t = RVar5.m_t;
    uVar3 = this->timestamp;
    this->lastrtptimestamp = uVar3;
    this->prevrtptimestamp = uVar3;
  }
  else {
    uVar3 = this->timestamp;
    if (uVar3 != this->prevrtptimestamp) {
      RVar5 = RTPTime::CurrentTime();
      goto LAB_001329a0;
    }
  }
  uVar1 = this->numpayloadbytes;
  uVar2 = this->numpackets;
  this->numpayloadbytes = (int)p.payloadlength + uVar1;
  this->numpackets = uVar2 + 1;
  this->timestamp = uVar3 + timestampinc;
  this->seqnr = this->seqnr + 1;
  iVar4 = 0;
LAB_001329eb:
  RTPPacket::~RTPPacket(&p);
  return iVar4;
}

Assistant:

int RTPPacketBuilder::PrivateBuildPacket(const void *data,size_t len,
	                  uint8_t pt,bool mark,uint32_t timestampinc,bool gotextension,
	                  uint16_t hdrextID,const void *hdrextdata,size_t numhdrextwords)
{
	RTPPacket p(pt,data,len,seqnr,timestamp,ssrc,mark,numcsrcs,csrcs,gotextension,hdrextID,
	            (uint16_t)numhdrextwords,hdrextdata,buffer,maxpacksize,GetMemoryManager());
	int status = p.GetCreationError();

	if (status < 0)
		return status;
	packetlength = p.GetPacketLength();

	if (numpackets == 0) // first packet
	{
		lastwallclocktime = RTPTime::CurrentTime();
		lastrtptimestamp = timestamp;
		prevrtptimestamp = timestamp;
	}
	else if (timestamp != prevrtptimestamp)
	{
		lastwallclocktime = RTPTime::CurrentTime();
		lastrtptimestamp = timestamp;
		prevrtptimestamp = timestamp;
	}
	
	numpayloadbytes += (uint32_t)p.GetPayloadLength();
	numpackets++;
	timestamp += timestampinc;
	seqnr++;

	return 0;
}